

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool cmakeCheckStampFile(char *stampName)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_619;
  cmFileTimeComparison ftc;
  string dep;
  string stampDepends;
  string stampTempString;
  int result;
  ifstream fin;
  byte abStack_390 [488];
  ostringstream stampTempStream;
  
  std::__cxx11::string::string((string *)&stampDepends,stampName,(allocator *)&fin);
  std::__cxx11::string::append((char *)&stampDepends);
  std::ifstream::ifstream(&fin,stampDepends._M_dataplus._M_p,_S_in);
  if ((abStack_390[*(long *)(_fin + -0x18)] & 5) == 0) {
    cmFileTimeComparison::cmFileTimeComparison(&ftc);
    dep._M_dataplus._M_p = (pointer)&dep.field_2;
    dep._M_string_length = 0;
    dep.field_2._M_local_buf[0] = '\0';
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&dep,(bool *)0x0,-1);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&stampTempStream);
          poVar2 = std::operator<<((ostream *)&stampTempStream,stampName);
          poVar2 = std::operator<<(poVar2,".tmp");
          cmSystemTools::RandomSeed();
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__cxx11::stringbuf::str();
          std::ofstream::ofstream(&result,stampTempString._M_dataplus._M_p,_S_out);
          std::operator<<((ostream *)&result,
                          "# CMake generation timestamp file for this directory.\n");
          std::ofstream::~ofstream(&result);
          bVar1 = cmSystemTools::RenameFile(stampTempString._M_dataplus._M_p,stampName);
          if (bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cout,"CMake does not need to re-run because ")
            ;
            poVar2 = std::operator<<(poVar2,stampName);
            std::operator<<(poVar2," is up-to-date.\n");
          }
          else {
            std::__cxx11::string::string
                      ((string *)&result,stampTempString._M_dataplus._M_p,&local_619);
            cmsys::SystemTools::RemoveFile((string *)&result);
            std::__cxx11::string::~string((string *)&result);
            cmSystemTools::Error("Cannot restore timestamp ",stampName,(char *)0x0,(char *)0x0);
          }
          std::__cxx11::string::~string((string *)&stampTempString);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stampTempStream);
          goto LAB_003294ff;
        }
      } while ((dep._M_string_length == 0) || (*dep._M_dataplus._M_p == '#'));
      bVar1 = cmFileTimeComparison::FileTimeCompare
                        (&ftc,stampDepends._M_dataplus._M_p,dep._M_dataplus._M_p,&result);
    } while (bVar1 && -1 < result);
    poVar2 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar2 = std::operator<<(poVar2,stampName);
    std::operator<<(poVar2," is out-of-date.\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  the file \'");
    poVar2 = std::operator<<(poVar2,(string *)&dep);
    std::operator<<(poVar2,"\'\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  is newer than \'");
    poVar2 = std::operator<<(poVar2,(string *)&stampDepends);
    std::operator<<(poVar2,"\'\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  result=\'");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,result);
    std::operator<<(poVar2,"\'\n");
    bVar1 = false;
LAB_003294ff:
    std::__cxx11::string::~string((string *)&dep);
    cmFileTimeComparison::~cmFileTimeComparison(&ftc);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar2 = std::operator<<(poVar2,stampName);
    std::operator<<(poVar2," dependency file is missing.\n");
    bVar1 = false;
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&stampDepends);
  return bVar1;
}

Assistant:

static bool cmakeCheckStampFile(const char* stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = stampName;
  stampDepends += ".depend";
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in);
#endif
  if(!fin)
    {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
    }

  // Compare the stamp dependencies against the dependency file itself.
  cmFileTimeComparison ftc;
  std::string dep;
  while(cmSystemTools::GetLineFromStream(fin, dep))
    {
    int result;
    if(!dep.empty() && dep[0] != '#' &&
       (!ftc.FileTimeCompare(stampDepends.c_str(), dep.c_str(), &result)
        || result < 0))
      {
      // The stamp depends file is older than this dependency.  The
      // build system is really out of date.
      std::cout << "CMake is re-running because " << stampName
                << " is out-of-date.\n";
      std::cout << "  the file '" << dep << "'\n";
      std::cout << "  is newer than '" << stampDepends << "'\n";
      std::cout << "  result='" << result << "'\n";
      return false;
      }
    }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTempString = stampTempStream.str();
  const char* stampTemp = stampTempString.c_str();
  {
  // TODO: Teach cmGeneratedFileStream to use a random temp file (with
  // multiple tries in unlikely case of conflict) and use that here.
  cmsys::ofstream stamp(stampTemp);
  stamp << "# CMake generation timestamp file for this directory.\n";
  }
  if(cmSystemTools::RenameFile(stampTemp, stampName))
    {
    // Notify the user why CMake is not re-running.  It is safe to
    // just print to stdout here because this code is only reachable
    // through an undocumented flag used by the VS generator.
    std::cout << "CMake does not need to re-run because "
              << stampName << " is up-to-date.\n";
    return true;
    }
  else
    {
    cmSystemTools::RemoveFile(stampTemp);
    cmSystemTools::Error("Cannot restore timestamp ", stampName);
    return false;
    }
}